

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageWriter.cpp
# Opt level: O1

void __thiscall MILBlob::Blob::StorageWriter::Impl::~Impl(Impl *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  std::unique_ptr<MILBlob::Blob::FileWriter,_std::default_delete<MILBlob::Blob::FileWriter>_>::
  ~unique_ptr(&this->m_fileWriter);
  pcVar1 = (this->m_filePath)._M_dataplus._M_p;
  paVar2 = &(this->m_filePath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Impl() = default;